

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumValueDescriptor::CopyTo
          (EnumValueDescriptor *this,EnumValueDescriptorProto *proto)

{
  byte *pbVar1;
  uint uVar2;
  pointer pcVar3;
  size_type sVar4;
  FeatureSet *from;
  EnumValueOptions *this_00;
  EnumValueOptions *pEVar5;
  FeatureSet *this_01;
  Arena *pAVar6;
  string_view value;
  
  pcVar3 = (this->all_names_->_M_dataplus)._M_p;
  sVar4 = this->all_names_->_M_string_length;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value._M_str = pcVar3;
  value._M_len = sVar4;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar6);
  (proto->field_0)._impl_.number_ = this->number_;
  uVar2 = *(uint *)&proto->field_0;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 4;
  pEVar5 = this->options_;
  if (pEVar5 != (EnumValueOptions *)_EnumValueOptions_default_instance_) {
    (proto->field_0)._impl_._has_bits_.has_bits_[0] = uVar2 | 6;
    this_00 = (proto->field_0)._impl_.options_;
    if (this_00 == (EnumValueOptions *)0x0) {
      pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      this_00 = (EnumValueOptions *)
                Arena::DefaultConstruct<google::protobuf::EnumValueOptions>(pAVar6);
      (proto->field_0)._impl_.options_ = this_00;
    }
    EnumValueOptions::CopyFrom(this_00,pEVar5);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    pEVar5 = (proto->field_0)._impl_.options_;
    if (pEVar5 == (EnumValueOptions *)0x0) {
      pAVar6 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      pEVar5 = (EnumValueOptions *)
               Arena::DefaultConstruct<google::protobuf::EnumValueOptions>(pAVar6);
      (proto->field_0)._impl_.options_ = pEVar5;
    }
    pbVar1 = (byte *)((long)&pEVar5->field_0 + 0x18);
    *pbVar1 = *pbVar1 | 1;
    this_01 = (pEVar5->field_0)._impl_.features_;
    if (this_01 == (FeatureSet *)0x0) {
      pAVar6 = (Arena *)(pEVar5->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      this_01 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(pAVar6);
      (pEVar5->field_0)._impl_.features_ = this_01;
    }
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void EnumValueDescriptor::CopyTo(EnumValueDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  if (&options() != &EnumValueOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}